

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_table.c
# Opt level: O2

void com_dct_coef_init(void)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  s8 *psVar7;
  s8 *psVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double __x;
  double dVar14;
  double __x_00;
  double dVar15;
  double __x_01;
  double w0;
  
  uVar4 = 2;
  psVar7 = g_tbl_itrans_coeffs;
  for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
    iVar2 = (int)uVar4;
    __x = (double)iVar2;
    if (__x < 0.0) {
      dVar14 = sqrt(__x);
    }
    else {
      dVar14 = SQRT(__x);
    }
    dVar14 = dVar14 * 32.0;
    __x_00 = 2.0 / __x;
    dVar15 = __x + 0.5;
    __x_01 = 2.0 / dVar15;
    uVar3 = iVar2 * iVar2;
    psVar8 = psVar7;
    for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      dVar1 = *(double *)(&DAT_00159b18 + (ulong)(uVar5 == 0) * 8);
      dVar10 = ((double)(int)uVar5 + 0.5) * 3.141592653589793;
      lVar9 = 0;
      while (iVar2 != lVar9) {
        dVar11 = (double)(int)lVar9 + 0.5;
        dVar12 = cos((dVar11 * 3.141592653589793 * (double)(int)uVar5) / __x);
        dVar13 = SQRT(__x_00);
        if (__x_00 < 0.0) {
          dVar13 = sqrt(__x_00);
        }
        dVar13 = dVar12 * dVar1 * dVar13;
        psVar8[lVar9] =
             (s8)(int)(dVar13 * dVar14 + *(double *)(&DAT_00159b28 + (ulong)(0.0 < dVar13) * 8));
        dVar11 = cos((dVar11 * dVar10) / dVar15);
        dVar13 = SQRT(__x_01);
        if (__x_01 < 0.0) {
          dVar13 = sqrt(__x_01);
        }
        psVar8[lVar9 + (ulong)uVar3] =
             (s8)(int)(dVar11 * dVar13 * dVar14 +
                      *(double *)(&DAT_00159b28 + (ulong)(0.0 < dVar11 * dVar13) * 8));
        dVar11 = sin(((double)(int)(lVar9 + 1) * dVar10) / dVar15);
        dVar13 = SQRT(__x_01);
        if (__x_01 < 0.0) {
          dVar13 = sqrt(__x_01);
        }
        psVar8[lVar9 + (ulong)(uVar3 * 2)] =
             (s8)(int)(dVar11 * dVar13 * dVar14 +
                      *(double *)(&DAT_00159b28 + (ulong)(0.0 < dVar11 * dVar13) * 8));
        lVar9 = lVar9 + 1;
      }
      psVar8 = psVar8 + iVar2;
    }
    g_tbl_itrans[0][lVar6] = psVar7;
    g_tbl_itrans[1][lVar6] = psVar7 + uVar3;
    g_tbl_itrans[2][lVar6] = psVar7 + iVar2 * iVar2 * 2;
    psVar7 = psVar7 + (int)(uVar3 * 3);
    uVar4 = (ulong)(uint)(iVar2 * 2);
  }
  return;
}

Assistant:

void com_dct_coef_init()
{
    int i, blk_size = 2;
    const double PI = 3.14159265358979323846;
    s8 *coeffs = g_tbl_itrans_coeffs;

    for (i = 0; i < 6; i++) {
        const double s = sqrt((double)blk_size) * 32;

        for (int k = 0; k < blk_size; k++) {
            for (int n = 0; n < blk_size; n++) {
                double w0, v;
                
                // DCT2
                w0 = k == 0 ? sqrt(0.5) : 1;
                v = cos(PI * (n + 0.5) * k / blk_size) * w0 * sqrt(2.0 / blk_size);
                coeffs[DCT2 * blk_size * blk_size + k * blk_size + n] = (s8)(s * v + (v > 0 ? 0.5 : -0.5));
                
                // DCT8
                v = cos(PI*(k + 0.5)*(n + 0.5) / (blk_size + 0.5)) * sqrt(2.0 / (blk_size + 0.5));
                coeffs[DCT8*blk_size*blk_size + k * blk_size + n] = (s8)(s * v + (v > 0 ? 0.5 : -0.5));

                // DST7
                v = sin(PI*(k + 0.5)*(n + 1) / (blk_size + 0.5)) * sqrt(2.0 / (blk_size + 0.5));
                coeffs[DST7*blk_size*blk_size + k * blk_size + n] = (s8)(s * v + (v > 0 ? 0.5 : -0.5));

            }
        }
        
        g_tbl_itrans[DCT2][i] = coeffs;
        g_tbl_itrans[DCT8][i] = coeffs + DCT8*blk_size*blk_size;
        g_tbl_itrans[DST7][i] = coeffs + DST7*blk_size*blk_size;

        coeffs += NUM_TRANS_TYPE * blk_size*blk_size;

        blk_size <<= 1;
    }
}